

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

bool __thiscall fp::Algorithm::IsExplored(Algorithm *this,array<int,_2UL> cur_node)

{
  reference this_00;
  reference pvVar1;
  
  this_00 = std::array<std::array<bool,_16UL>,_16UL>::at
                      (&this->explored_node_,(long)cur_node._M_elems[0]);
  pvVar1 = std::array<bool,_16UL>::at(this_00,(long)cur_node._M_elems >> 0x20);
  return *pvVar1;
}

Assistant:

bool fp::Algorithm::IsExplored(std::array<int, 2> cur_node) {
    return this->explored_node_.at(cur_node.at(0)).at(cur_node.at(1));
}